

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_h_predictor_4x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined4 uVar2;
  undefined1 auVar3 [13];
  ushort uVar4;
  short sVar5;
  byte bVar7;
  ushort uVar6;
  ushort uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  bVar1 = top_row[3];
  uVar2 = *(undefined4 *)left_column;
  bVar7 = (byte)((uint)uVar2 >> 0x18);
  uVar4 = (ushort)(byte)uVar2;
  auVar3[0xc] = bVar7;
  auVar3._0_12_ = ZEXT712(0);
  uVar8 = (ushort)(byte)((uint)uVar2 >> 0x10);
  uVar6 = (ushort)(byte)((uint)uVar2 >> 8);
  iVar9 = bVar1 + 0x800080;
  iVar10 = (ushort)((ushort)bVar1 * 0x6b) + 0x800080;
  iVar11 = (ushort)((ushort)bVar1 * 0xab) + 0x800080;
  iVar12 = (ushort)((ushort)bVar1 * 0xc0) + 0x800080;
  auVar13._0_4_ = (uint)(ushort)(uVar4 * 0xff) + iVar9;
  auVar13._4_4_ = (uint)(ushort)((ushort)(byte)uVar2 * 0x95) + iVar10;
  auVar13._8_4_ = (uint)(ushort)(uVar4 * 0x55) + iVar11;
  auVar13._12_4_ = (uint)(ushort)(uVar4 * 0x40) + iVar12;
  auVar17 = ZEXT416(0xd090501);
  auVar14 = pshufb(auVar13,auVar17);
  *(int *)dst = auVar14._0_4_;
  auVar15._0_4_ = (uint)(ushort)(uVar6 * 0xff) + iVar9;
  auVar15._4_4_ = (uint)(ushort)(uVar6 * 0x95) + iVar10;
  auVar15._8_4_ = (uint)(ushort)(uVar6 * 0x55) + iVar11;
  auVar15._12_4_ = (uint)(ushort)(uVar6 * 0x40) + iVar12;
  auVar14 = pshufb(auVar15,auVar17);
  *(int *)(dst + stride) = auVar14._0_4_;
  auVar16._0_4_ = (uint)(ushort)(uVar8 * 0xff) + iVar9;
  auVar16._4_4_ = (uint)(ushort)(uVar8 * 0x95) + iVar10;
  auVar16._8_4_ = (uint)(ushort)(uVar8 * 0x55) + iVar11;
  auVar16._12_4_ = (uint)(ushort)(uVar8 * 0x40) + iVar12;
  auVar14 = pshufb(auVar16,auVar17);
  *(int *)(dst + stride * 2) = auVar14._0_4_;
  sVar5 = (short)(auVar3._10_3_ >> 0x10);
  auVar14._0_4_ = (uint)(ushort)(sVar5 * 0xff) + iVar9;
  auVar14._4_4_ = (uint)(ushort)((ushort)bVar7 * 0x95) + iVar10;
  auVar14._8_4_ = (uint)(ushort)(sVar5 * 0x55) + iVar11;
  auVar14._12_4_ = (uint)(ushort)(sVar5 * 0x40) + iVar12;
  auVar14 = pshufb(auVar14,auVar17);
  *(int *)(dst + stride * 3) = auVar14._0_4_;
  return;
}

Assistant:

void aom_smooth_h_predictor_4x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi32(top_row[3]);
  const __m128i left = cvtepu8_epi32(Load4(left_column));
  const __m128i weights = cvtepu8_epi32(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi32(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
}